

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O1

void XmlReporter__will_report_a_failing_test_only_once(void)

{
  char *pcVar1;
  undefined8 uVar2;
  va_list null_arguments;
  __va_list_tag local_38;
  
  local_38.gp_offset = 0;
  local_38.fp_offset = 0;
  local_38.overflow_arg_area = (void *)0x0;
  local_38.reg_save_area = (void *)0x0;
  (*reporter->start_test)(reporter,"test_name");
  (*reporter->show_fail)(reporter,"file",2,"test_failure_message",&local_38);
  (*reporter->show_fail)(reporter,"file",2,"other_message",&local_38);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar1 = strstr(output,"<failure message=\"test_failure_message\">");
  uVar2 = create_not_null_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x8b,
               "pointer_to_substring(output, \"<failure message=\\\"test_failure_message\\\">\")",
               pcVar1,uVar2);
  pcVar1 = strstr(output,"<failure message=\"other_message\">");
  uVar2 = create_not_null_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x8c,"pointer_to_substring(output, \"<failure message=\\\"other_message\\\">\")",
               pcVar1,uVar2);
  pcVar1 = strstr(output,"<failure message=\"test_failure_message\">");
  pcVar1 = strstr(pcVar1 + 1,"<failure message=\"test_failure_message\">");
  uVar2 = create_is_null_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x8d,
               "pointer_to_second_substring(output, \"<failure message=\\\"test_failure_message\\\">\")"
               ,pcVar1,uVar2);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}